

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O0

void __thiscall
Privkey_FromWif_testnet_compressed_Test::~Privkey_FromWif_testnet_compressed_Test
          (Privkey_FromWif_testnet_compressed_Test *this)

{
  Privkey_FromWif_testnet_compressed_Test *this_local;
  
  ~Privkey_FromWif_testnet_compressed_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, FromWif_testnet_compressed) {
  std::string wif = "cPCirFtGH3KUJ4ZusGdRUiW5iL3Y2PEM9gxSMRM3YSG6Eon9heJj";
  Privkey privkey = Privkey::FromWif(wif, NetType::kTestnet, true);
  EXPECT_STREQ(
      privkey.GetHex().c_str(),
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");

  Privkey from_hex("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  EXPECT_TRUE(privkey.Equals(from_hex));

  EXPECT_STREQ(privkey.GetWif().c_str(), wif.c_str());
}